

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int luaopen_table(lua_State *L)

{
  GCtab *in_RDI;
  char *in_stack_00000008;
  lua_State *in_stack_00000010;
  lua_CFunction *in_stack_00000078;
  uint8_t *in_stack_00000080;
  char *in_stack_00000088;
  lua_State *in_stack_00000090;
  
  lj_lib_register(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  lj_lib_prereg(in_stack_00000010,in_stack_00000008,(lua_CFunction)L,in_RDI);
  lj_lib_prereg(in_stack_00000010,in_stack_00000008,(lua_CFunction)L,in_RDI);
  return 1;
}

Assistant:

LUALIB_API int luaopen_table(lua_State *L)
{
  LJ_LIB_REG(L, LUA_TABLIBNAME, table);
#if LJ_52
  lua_getglobal(L, "unpack");
  lua_setfield(L, -2, "unpack");
#endif
  lj_lib_prereg(L, LUA_TABLIBNAME ".new", luaopen_table_new, tabV(L->top-1));
  lj_lib_prereg(L, LUA_TABLIBNAME ".clear", luaopen_table_clear, tabV(L->top-1));
  return 1;
}